

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

int re2::CEscapeString(char *src,int src_len,char *dest,int dest_len)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  
  if (src_len < 1) {
    iVar5 = 0;
  }
  else {
    pbVar6 = (byte *)(src + src_len);
    iVar5 = 0;
    do {
      if (dest_len - iVar5 < 2) {
        return -1;
      }
      bVar1 = *src;
      if (bVar1 < 0x22) {
        if (bVar1 == 9) {
          (dest + iVar5)[0] = '\\';
          (dest + iVar5)[1] = 't';
          goto LAB_0011e84b;
        }
        if (bVar1 == 10) {
          (dest + iVar5)[0] = '\\';
          (dest + iVar5)[1] = 'n';
          goto LAB_0011e84b;
        }
        if (bVar1 == 0xd) {
          (dest + iVar5)[0] = '\\';
          (dest + iVar5)[1] = 'r';
          goto LAB_0011e84b;
        }
LAB_0011e825:
        if (0xa0 < (byte)(bVar1 + 0x81)) {
          lVar3 = (long)iVar5;
          iVar5 = iVar5 + 1;
          dest[lVar3] = bVar1;
          goto LAB_0011e84f;
        }
        if (4 < dest_len - iVar5) {
          snprintf(dest + iVar5,5,"\\%03o");
          iVar5 = iVar5 + 4;
          goto LAB_0011e84f;
        }
        bVar2 = false;
      }
      else {
        if (bVar1 == 0x22) {
          (dest + iVar5)[0] = '\\';
          (dest + iVar5)[1] = '\"';
        }
        else if (bVar1 == 0x27) {
          (dest + iVar5)[0] = '\\';
          (dest + iVar5)[1] = '\'';
        }
        else {
          if (bVar1 != 0x5c) goto LAB_0011e825;
          (dest + iVar5)[0] = '\\';
          (dest + iVar5)[1] = '\\';
        }
LAB_0011e84b:
        iVar5 = iVar5 + 2;
LAB_0011e84f:
        bVar2 = true;
      }
      if (!bVar2) {
        return -1;
      }
      src = (char *)((byte *)src + 1);
    } while (src < pbVar6);
  }
  iVar4 = -1;
  if (iVar5 < dest_len) {
    dest[iVar5] = '\0';
    iVar4 = iVar5;
  }
  return iVar4;
}

Assistant:

int CEscapeString(const char* src, int src_len, char* dest,
                  int dest_len) {
  const char* src_end = src + src_len;
  int used = 0;

  for (; src < src_end; src++) {
    if (dest_len - used < 2)   // space for two-character escape
      return -1;

    unsigned char c = *src;
    switch (c) {
      case '\n': dest[used++] = '\\'; dest[used++] = 'n';  break;
      case '\r': dest[used++] = '\\'; dest[used++] = 'r';  break;
      case '\t': dest[used++] = '\\'; dest[used++] = 't';  break;
      case '\"': dest[used++] = '\\'; dest[used++] = '\"'; break;
      case '\'': dest[used++] = '\\'; dest[used++] = '\''; break;
      case '\\': dest[used++] = '\\'; dest[used++] = '\\'; break;
      default:
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        if (c < ' ' || c > '~') {
          if (dest_len - used < 5)   // space for four-character escape + \0
            return -1;
#if !defined(_WIN32)
          snprintf(dest + used, 5, "\\%03o", c);
#else
          // On Windows, the function takes 4+VA arguments, not 3+VA. With an
          // array, the buffer size will be inferred, but not with a pointer.
          snprintf(dest + used, 5, _TRUNCATE, "\\%03o", c);
#endif
          used += 4;
        } else {
          dest[used++] = c; break;
        }
    }
  }

  if (dest_len - used < 1)   // make sure that there is room for \0
    return -1;

  dest[used] = '\0';   // doesn't count towards return value though
  return used;
}